

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMin.hpp
# Opt level: O2

void __thiscall
StackMin<long,_std::less_equal<long>_>::push(StackMin<long,_std::less_equal<long>_> *this,long *e)

{
  _Elt_pointer plVar1;
  _Elt_pointer plVar2;
  
  plVar2 = (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  plVar1 = (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  std::deque<long,_std::allocator<long>_>::push_back((deque<long,_std::allocator<long>_> *)this,e);
  if (plVar2 != plVar1) {
    plVar2 = (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (plVar2 == (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      plVar2 = (this->min_).c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (plVar2[-1] < *e) {
      return;
    }
  }
  std::deque<long,_std::allocator<long>_>::push_back(&(this->min_).c,e);
  return;
}

Assistant:

void push(const Type& e){
    if (min_.empty()){
      stk_.push(e);
      min_.push(e);
    }
    else{
      stk_.push(e);

      if (cmp_(e, min_.top())){
        min_.push(e);
      }
    }
  }